

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O1

void garray_read(_garray *x,t_symbol *filename)

{
  uint uVar1;
  int iVar2;
  _glist *x_00;
  _glist *x_01;
  undefined4 *puVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  int elemsize;
  int yonset;
  double f;
  char *bufptr;
  char buf [1000];
  int local_448;
  int local_444;
  _garray *local_440;
  FILE *local_438;
  t_symbol *local_430;
  double local_428;
  char *local_420;
  char local_418 [1000];
  
  x_00 = (_glist *)garray_getarray_floatonly(x,&local_444,&local_448);
  if (x_00 == (_glist *)0x0) {
    pd_error((void *)0x0,"%s: needs floating-point \'y\' field",x->x_realname->s_name);
    return;
  }
  uVar1 = *(uint *)&(x_00->gl_obj).te_g.g_pd;
  x_01 = glist_getcanvas(x_00);
  iVar2 = canvas_open(x_01,filename->s_name,"",local_418,&local_420,1000,0);
  if ((iVar2 < 0) || (local_438 = fdopen(iVar2,"r"), local_438 == (FILE *)0x0)) {
    pd_error((void *)0x0,"%s: can\'t open",filename->s_name);
  }
  else {
    if ((int)uVar1 < 1) {
      iVar2 = 0;
    }
    else {
      lVar5 = (long)local_448;
      lVar6 = (long)local_444 << 2;
      uVar4 = 0;
      local_440 = x;
      local_430 = filename;
      do {
        iVar2 = __isoc99_fscanf(local_438,"%lf",&local_428);
        if (iVar2 == 0) {
          post("%s: read %d elements into table of size %d",local_430->s_name,uVar4 & 0xffffffff,
               (ulong)uVar1);
          goto LAB_00134fd8;
        }
        *(float *)((long)&((x_00->gl_obj).te_g.g_next)->g_pd + lVar6) = (float)local_428;
        uVar4 = uVar4 + 1;
        lVar6 = lVar6 + lVar5;
      } while (uVar1 != uVar4);
      uVar4 = (ulong)uVar1;
LAB_00134fd8:
      iVar2 = (int)uVar4;
      x = local_440;
    }
    if (iVar2 < (int)uVar1) {
      lVar5 = (long)(int)uVar1 - (long)iVar2;
      puVar3 = (undefined4 *)
               ((long)&((x_00->gl_obj).te_g.g_next)->g_pd +
               (long)iVar2 * (long)local_448 + (long)local_444 * 4);
      do {
        *puVar3 = 0;
        puVar3 = (undefined4 *)((long)puVar3 + (long)local_448);
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    fclose(local_438);
    garray_redraw(x);
  }
  return;
}

Assistant:

static void garray_read(t_garray *x, t_symbol *filename)
{
    int nelem, filedesc, i;
    FILE *fd;
    char buf[MAXPDSTRING], *bufptr;
    int yonset, elemsize;
    t_array *array = garray_getarray_floatonly(x, &yonset, &elemsize);
    if (!array)
    {
        pd_error(0, "%s: needs floating-point 'y' field", x->x_realname->s_name);
        return;
    }
    nelem = array->a_n;
    if ((filedesc = canvas_open(glist_getcanvas(x->x_glist),
            filename->s_name, "", buf, &bufptr, MAXPDSTRING, 0)) < 0
                || !(fd = fdopen(filedesc, "r")))
    {
        pd_error(0, "%s: can't open", filename->s_name);
        return;
    }
    for (i = 0; i < nelem; i++)
    {
        double f;
        if (!fscanf(fd, "%lf", &f))
        {
            post("%s: read %d elements into table of size %d",
                filename->s_name, i, nelem);
            break;
        }
        else *((t_float *)(array->a_vec + elemsize * i) + yonset) = f;
    }
    while (i < nelem)
        *((t_float *)(array->a_vec +
            elemsize * i) + yonset) = 0, i++;
    fclose(fd);
    garray_redraw(x);
}